

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  BYTE *codeTable;
  BYTE *codeTable_00;
  BYTE *codeTable_01;
  ZSTD_compressedBlockState_t *CTable;
  uint *count;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong nbSeq;
  ulong sourceSize;
  uint *countWksp;
  U32 defaultMax;
  undefined1 *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  uint maxSymbolValue;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  sVar1 = ZSTD_buildBlockEntropyStats
                    (seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,&entropyMetadata,
                     zc->entropyWorkspace,0x19d8);
  if (sVar1 < 0xffffffffffffff89) {
    sourceSize = (long)seqStore->lit - (long)seqStore->litStart;
    codeTable = seqStore->ofCode;
    codeTable_00 = seqStore->llCode;
    codeTable_01 = seqStore->mlCode;
    nbSeq = (long)seqStore->sequences - (long)seqStore->sequencesStart >> 3;
    CTable = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    maxSymbolValue = 0xff;
    if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
      in_stack_fffffffffffffe70 = (undefined1 *)0x577883;
      sVar1 = HIST_count_wksp(count,(uint *)&stack0xfffffffffffffe7c,seqStore->litStart,sourceSize,
                              count,0x19d8);
      if (sVar1 < 0xffffffffffffff89) {
        in_stack_fffffffffffffe70 = (undefined1 *)0x57789c;
        sVar1 = HUF_estimateCompressedSize((HUF_CElt *)CTable,count,maxSymbolValue);
        if (entropyMetadata.hufMetadata.hType != set_compressed) {
          entropyMetadata.hufMetadata.hufDesSize = 0;
        }
        sVar2 = entropyMetadata.hufMetadata.hufDesSize + 6;
        if (sourceSize < 0x100) {
          sVar2 = entropyMetadata.hufMetadata.hufDesSize;
        }
        sourceSize = ((ulong)(0x3ff < sourceSize) - (ulong)(sourceSize < 0x4000)) + 4 +
                     sVar2 + sVar1;
      }
    }
    else if (entropyMetadata.hufMetadata.hType != set_basic) {
      if (entropyMetadata.hufMetadata.hType == set_rle) {
        in_stack_fffffffffffffe70 = &DAT_00000001;
        sourceSize = 1;
      }
      else {
        sourceSize = 0;
      }
    }
    defaultMax = (U32)count;
    sVar1 = ZSTD_estimateBlockSize_symbolType
                      (entropyMetadata.fseMetadata.ofType,codeTable,nbSeq,0x1f,
                       (CTable->entropy).fse.offcodeCTable,(U32 *)0x0,OF_defaultNorm,5,defaultMax,
                       in_stack_fffffffffffffe70,CONCAT44(maxSymbolValue,in_stack_fffffffffffffe78))
    ;
    sVar2 = ZSTD_estimateBlockSize_symbolType
                      (entropyMetadata.fseMetadata.llType,codeTable_00,nbSeq,0x23,
                       (CTable->entropy).fse.litlengthCTable,LL_bits,LL_defaultNorm,6,defaultMax,
                       in_stack_fffffffffffffe70,CONCAT44(maxSymbolValue,in_stack_fffffffffffffe78))
    ;
    sVar3 = ZSTD_estimateBlockSize_symbolType
                      (entropyMetadata.fseMetadata.mlType,codeTable_01,nbSeq,0x34,
                       (CTable->entropy).fse.matchlengthCTable,ML_bits,ML_defaultNorm,6,defaultMax,
                       in_stack_fffffffffffffe70,CONCAT44(maxSymbolValue,in_stack_fffffffffffffe78))
    ;
    sVar1 = entropyMetadata.fseMetadata.fseTablesSize +
            sVar1 + sourceSize + sVar2 + sVar3 + ((ulong)(0x7f < nbSeq) - (ulong)(nbSeq < 0x7f00)) +
            6;
  }
  return sVar1;
}

Assistant:

static size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, const ZSTD_CCtx* zc) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    &entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");
    return ZSTD_estimateBlockSize(seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy, &entropyMetadata, zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata.hufMetadata.hType == set_compressed), 1);
}